

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O0

void __thiscall NJamSpell::TBloomFilter::Impl::Dump(Impl *this,ostream *out)

{
  ostream *out_local;
  Impl *this_local;
  
  NHandyPack::
  Dump<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_int,unsigned_long_long,unsigned_long_long,unsigned_long_long,unsigned_long_long,double>
            (out,&(this->super_bloom_filter).salt_,&(this->super_bloom_filter).bit_table_,
             &(this->super_bloom_filter).salt_count_,&(this->super_bloom_filter).table_size_,
             &(this->super_bloom_filter).projected_element_count_,
             &(this->super_bloom_filter).inserted_element_count_,
             &(this->super_bloom_filter).random_seed_,
             &(this->super_bloom_filter).desired_false_positive_probability_);
  return;
}

Assistant:

void Dump(std::ostream& out) const {
        NHandyPack::Dump(out, salt_, bit_table_, salt_count_, table_size_,
                        projected_element_count_, inserted_element_count_,
                        random_seed_, desired_false_positive_probability_);
    }